

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_setpath(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  CHAR_DATA *ch_00;
  char *name;
  char *txt;
  char *__format;
  char arg1 [4608];
  char temp [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar3 = one_argument(argument,local_2438);
  if ((*pcVar3 == '\0') || (local_2438[0] == '\0')) {
    pcVar3 = "Syntax: setpath <character> <protector/crusader>\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_2438);
    if (ch_00 != (CHAR_DATA *)0x0) {
      name = "protector";
      iVar2 = strcmp(pcVar3,"protector");
      if (iVar2 == 0) {
        __format = "AUTO: %s inducted them into Protector path.\n\r";
        txt = "Your path has been set, you will follow that of the Protector of Shalar.\n\r";
        pcVar3 = "You have set that character\'s path to Protector.\n\r";
        sVar1 = 1;
      }
      else {
        name = "crusader";
        iVar2 = strcmp(pcVar3,"crusader");
        if (iVar2 != 0) {
          pcVar3 = "That\'s not a paladin path.\n\r";
          goto LAB_002771d7;
        }
        __format = "AUTO: %s inducted them into Crusader path.\n\r";
        txt = "Your path has been set, you will follow that of the Crusader of Shalar.\n\r";
        pcVar3 = "You have set that character\'s path to Crusader.\n\r";
        sVar1 = 2;
      }
      ch_00->pcdata->paladin_path = sVar1;
      group_add(ch_00,name,false);
      send_to_char(pcVar3,ch);
      send_to_char(txt,ch_00);
      sprintf(local_1238,__format,ch->true_name);
      add_history((CHAR_DATA *)0x0,ch_00,local_1238);
      return;
    }
    pcVar3 = "You cannot find that person.\n\r";
  }
LAB_002771d7:
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_setpath(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], temp[MSL];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);

	if (argument[0] == '\0' || arg1[0] == '\0')
	{
		send_to_char("Syntax: setpath <character> <protector/crusader>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("You cannot find that person.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "protector"))
	{
		victim->pcdata->paladin_path = PALADIN_PROTECTOR;

		group_add(victim, "protector", false);

		send_to_char("You have set that character's path to Protector.\n\r", ch);
		send_to_char("Your path has been set, you will follow that of the Protector of Shalar.\n\r", victim);

		sprintf(temp, "AUTO: %s inducted them into Protector path.\n\r", ch->true_name);
	}
	else if (!strcmp(argument, "crusader"))
	{
		victim->pcdata->paladin_path = PALADIN_CRUSADER;

		group_add(victim, "crusader", false);

		send_to_char("You have set that character's path to Crusader.\n\r", ch);
		send_to_char("Your path has been set, you will follow that of the Crusader of Shalar.\n\r", victim);

		sprintf(temp, "AUTO: %s inducted them into Crusader path.\n\r", ch->true_name);
	}
	else
	{
		send_to_char("That's not a paladin path.\n\r", ch);
		return;
	}
	
	add_history(nullptr, victim, temp);
}